

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O3

void duckdb_je_tcache_arena_associate
               (tsdn_t *tsdn,tcache_slow_t *tcache_slow,tcache_t *tcache,arena_t *arena)

{
  pthread_mutex_t *__mutex;
  uint64_t *puVar1;
  witness_t **ppwVar2;
  tcache_slow_t *ptVar3;
  cache_bin_array_descriptor_t *pcVar4;
  cache_bin_array_descriptor_t *pcVar5;
  int iVar6;
  cache_bin_array_descriptor_t *pcVar7;
  tcache_slow_t *ptVar8;
  
  tcache_slow->arena = arena;
  __mutex = (pthread_mutex_t *)((long)&(arena->tcache_ql_mtx).field_0 + 0x48);
  iVar6 = pthread_mutex_trylock(__mutex);
  if (iVar6 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&arena->tcache_ql_mtx);
    (arena->tcache_ql_mtx).field_0.field_0.locked.repr = true;
  }
  puVar1 = &(arena->tcache_ql_mtx).field_0.field_0.prof_data.n_lock_ops;
  *puVar1 = *puVar1 + 1;
  if ((arena->tcache_ql_mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
    (arena->tcache_ql_mtx).field_0.field_0.prof_data.prev_owner = tsdn;
    ppwVar2 = &(arena->tcache_ql_mtx).field_0.witness.link.qre_prev;
    *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
  }
  (tcache_slow->link).qre_next = tcache_slow;
  (tcache_slow->link).qre_prev = tcache_slow;
  ptVar3 = (arena->tcache_ql).qlh_first;
  ptVar8 = tcache_slow;
  if (ptVar3 != (tcache_slow_t *)0x0) {
    (tcache_slow->link).qre_next = (ptVar3->link).qre_prev;
    (ptVar3->link).qre_prev = tcache_slow;
    ptVar8 = (((tcache_slow->link).qre_prev)->link).qre_next;
    (tcache_slow->link).qre_prev = ptVar8;
    (((ptVar3->link).qre_prev)->link).qre_next = ptVar3;
    (ptVar8->link).qre_next = tcache_slow;
    ptVar8 = (tcache_slow->link).qre_next;
  }
  (arena->tcache_ql).qlh_first = ptVar8;
  pcVar7 = &tcache_slow->cache_bin_array_descriptor;
  (tcache_slow->cache_bin_array_descriptor).link.qre_next = pcVar7;
  (tcache_slow->cache_bin_array_descriptor).link.qre_prev = pcVar7;
  (tcache_slow->cache_bin_array_descriptor).bins = tcache->bins;
  pcVar4 = (arena->cache_bin_array_descriptor_ql).qlh_first;
  if (pcVar4 != (cache_bin_array_descriptor_t *)0x0) {
    (tcache_slow->cache_bin_array_descriptor).link.qre_next = (pcVar4->link).qre_prev;
    (pcVar4->link).qre_prev = pcVar7;
    pcVar5 = (((tcache_slow->cache_bin_array_descriptor).link.qre_prev)->link).qre_next;
    (tcache_slow->cache_bin_array_descriptor).link.qre_prev = pcVar5;
    (((pcVar4->link).qre_prev)->link).qre_next = pcVar4;
    (pcVar5->link).qre_next = pcVar7;
    pcVar7 = (tcache_slow->cache_bin_array_descriptor).link.qre_next;
  }
  (arena->cache_bin_array_descriptor_ql).qlh_first = pcVar7;
  (arena->tcache_ql_mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void
tcache_arena_associate(tsdn_t *tsdn, tcache_slow_t *tcache_slow,
    tcache_t *tcache, arena_t *arena) {
	assert(tcache_slow->arena == NULL);
	tcache_slow->arena = arena;

	if (config_stats) {
		/* Link into list of extant tcaches. */
		malloc_mutex_lock(tsdn, &arena->tcache_ql_mtx);

		ql_elm_new(tcache_slow, link);
		ql_tail_insert(&arena->tcache_ql, tcache_slow, link);
		cache_bin_array_descriptor_init(
		    &tcache_slow->cache_bin_array_descriptor, tcache->bins);
		ql_tail_insert(&arena->cache_bin_array_descriptor_ql,
		    &tcache_slow->cache_bin_array_descriptor, link);

		malloc_mutex_unlock(tsdn, &arena->tcache_ql_mtx);
	}
}